

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_2.h
# Opt level: O1

void __thiscall
dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::enqueue
          (queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>
           *this,directory *item)

{
  node *pnVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  
  if (this->queue_size == 0) {
    pnVar1 = (node *)operator_new(0x508);
    paVar2 = &pnVar1->item[0].state.full_name.field_2;
    lVar3 = 0x500;
    do {
      paVar2[-3]._M_allocated_capacity = (size_type)(paVar2 + -2);
      *(undefined8 *)((long)paVar2 + -0x28) = 0;
      paVar2[-2]._M_local_buf[0] = 0;
      (((string *)(paVar2 + -1))->_M_dataplus)._M_p = (pointer)paVar2;
      *(size_type *)((long)paVar2 + -8) = 0;
      paVar2->_M_local_buf[0] = '\0';
      paVar2 = paVar2 + 4;
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != 0);
    this->in = pnVar1;
    this->out = pnVar1;
    this->in_pos = 0;
    this->out_pos = 0;
  }
  else if (0x13 < this->in_pos) {
    pnVar1 = (node *)operator_new(0x508);
    paVar2 = &pnVar1->item[0].state.full_name.field_2;
    lVar3 = 0x500;
    do {
      paVar2[-3]._M_allocated_capacity = (size_type)(paVar2 + -2);
      *(undefined8 *)((long)paVar2 + -0x28) = 0;
      paVar2[-2]._M_local_buf[0] = 0;
      (((string *)(paVar2 + -1))->_M_dataplus)._M_p = (pointer)paVar2;
      *(size_type *)((long)paVar2 + -8) = 0;
      paVar2->_M_local_buf[0] = '\0';
      paVar2 = paVar2 + 4;
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != 0);
    this->in->next = pnVar1;
    this->in_pos = 0;
    this->in = pnVar1;
  }
  std::swap<dlib::directory::data>(&item->state,&this->in->item[this->in_pos].state);
  this->queue_size = this->queue_size + 1;
  this->in_pos = this->in_pos + 1;
  (*(this->super_enumerable<dlib::directory>)._vptr_enumerable[3])(this);
  return;
}

Assistant:

void queue_kernel_2<T,block_size,mem_manager>::
    enqueue (
        T& item
    )
    {
        if (queue_size == 0)
        {
            out = in = pool.allocate();
            in_pos = 0;
            out_pos = 0;
        }
        else if (in_pos >= block_size)
        {            
            in->next = pool.allocate();
            in_pos = 0;
            in = in->next;
        }

        exchange(item,in->item[in_pos]);
        ++in_pos;

        ++queue_size;

        // put the enumerator at the start
        reset();
    }